

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O0

void Am_Fly_Apart_Animator_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  Am_Value local_48;
  undefined1 local_38 [8];
  Am_Value value;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *interp_local;
  
  local_10 = interp;
  pAVar1 = Am_Object::Get(interp,0x182,0);
  Am_Object::Set(interp,0x169,pAVar1,0);
  Am_Object::Am_Object(&local_18,interp);
  Am_Set_Animated_Slots(&local_18);
  Am_Object::~Am_Object(&local_18);
  delete_all_parts(interp);
  Am_Value::Am_Value((Am_Value *)local_38);
  pAVar1 = Am_Object::Peek(interp,0xc5,0);
  Am_Value::operator=((Am_Value *)local_38,pAVar1);
  Am_Value::Am_Value(&local_48,(Am_Value *)local_38);
  call_all_commands(&local_48,0xca,interp,false);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value((Am_Value *)local_38);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Fly_Apart_Animator_Do,
                 (Am_Object interp))
{
  Am_INTER_TRACE_PRINT(interp, "Fly Apart Stop of " << interp);

  // and assert the final visibility value
  interp.Set(Am_VALUE, interp.Get(Am_VALUE_2));
  Am_Set_Animated_Slots(interp);
  delete_all_parts(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_DO_METHOD, interp, false);
}